

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

namespace_t __thiscall cs::domain_manager::get_namespace(domain_manager *this)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  domain_type *this_00;
  size_t sVar3;
  anon_union_8_1_a8a14541_for_iterator_1 aVar4;
  anon_union_8_1_a8a14541_for_iterator_1 extraout_RDX;
  long in_RSI;
  domain_type *__range2;
  namespace_t nVar5;
  const_iterator __begin2;
  iterator local_40;
  
  std::make_shared<cs::name_space>();
  this_00 = stack_type<cs::domain_type,_std::allocator>::bottom
                      ((stack_type<cs::domain_type,_std::allocator> *)(in_RSI + 0x30));
  local_40 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)this_00);
  aVar4 = local_40.field_1;
  pcVar1 = (this_00->m_reflect).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .ctrl_;
  sVar2 = (this_00->m_reflect).
          super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          .
          super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          .capacity_;
  while (local_40.ctrl_ != pcVar1 + sVar2) {
    aVar4 = local_40.field_1;
    sVar3 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::count<std::__cxx11::string>
                      ((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)(in_RSI + 0x58),
                       (key_arg<std::__cxx11::basic_string<char>_> *)local_40.field_1.slot_);
    if (sVar3 == 0) {
      name_space::add_var((name_space *)this->fiber_stack,(string *)aVar4.slot_,
                          (this_00->m_slot).
                          super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
                          super__Vector_impl_data._M_start + *(long *)((long)aVar4.slot_ + 0x20));
    }
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::iterator::operator++(&local_40);
    aVar4 = extraout_RDX;
  }
  nVar5.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aVar4.slot_;
  nVar5.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (namespace_t)nVar5.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

namespace_t get_namespace() const
		{
			namespace_t nm = std::make_shared<name_space>();
			const domain_type &global = m_data.bottom();
			for (auto &it: global) {
				if (buildin_symbols.count(it.first) == 0)
					nm->add_var(it.first, global.get_var_by_id(it.second));
			}
			return nm;
		}